

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

Token * __thiscall Lexer::match_right_brace(Token *__return_storage_ptr__,Lexer *this)

{
  Type local_34;
  TokenPosition local_30;
  
  local_30.super_Position._vptr_Position =
       (_func_int **)CONCAT71(local_30.super_Position._vptr_Position._1_7_,1);
  consume(this,(bool *)&local_30);
  local_34 = kRightBrace;
  local_30.super_Position.row_ = (this->position_).super_Position.row_;
  local_30.super_Position.col_ = (this->position_).super_Position.col_;
  local_30.super_Position._vptr_Position = (_func_int **)&PTR_clear_001599f0;
  local_30.length_ = 1;
  Token::Token(__return_storage_ptr__,&local_34,&local_30);
  return __return_storage_ptr__;
}

Assistant:

Token Lexer::match_right_brace() {
    consume();
    return Token(Token::Type::kRightBrace, TokenPosition(position_, 1));
}